

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

pair<int,_pbrt::LightBounds> * __thiscall
pbrt::BVHLightSampler::buildBVH
          (pair<int,_pbrt::LightBounds> *__return_storage_ptr__,BVHLightSampler *this,
          vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          *bvhLights,int start,int end,uint32_t bitTrail,int depth,Allocator alloc)

{
  LightBVHNode *pLVar1;
  LightBounds *pLVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  LightBVHNode *pLVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  *bvhLights_00;
  BVHLightSampler *pBVar20;
  ulong uVar21;
  int i;
  uint uVar22;
  ulong uVar23;
  pointer ppVar24;
  pair<int,_pbrt::LightBounds> *ppVar25;
  bool bVar26;
  undefined4 in_register_0000000c;
  undefined8 uVar27;
  float *pfVar28;
  pointer ppVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  pointer ppVar33;
  long lVar34;
  int iVar35;
  vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *pvVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  Float FVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 uVar45;
  undefined1 auVar44 [64];
  float fVar46;
  undefined8 uVar47;
  undefined1 auVar48 [16];
  undefined8 uVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 uVar55;
  undefined8 uVar56;
  undefined1 auVar53 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  pair<int,_pbrt::LightBounds> child1;
  LightBounds lb;
  CompactLightBounds cb;
  Float cost [11];
  pair<int,_pbrt::LightBounds> child0;
  pair<int,_pbrt::LightBounds> *args_5;
  uint32_t local_4d0;
  ushort local_4ca;
  size_t local_4c8;
  float local_4bc;
  undefined8 local_4b8;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  *local_4b0;
  BVHLightSampler *local_4a8;
  pair<int,_pbrt::LightBounds> local_4a0;
  Bounds3f local_460;
  ulong local_440;
  vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *local_438;
  int local_430;
  int local_42c;
  float local_428;
  float local_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  pair<int,_pbrt::LightBounds> local_400;
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  long local_398;
  long local_390;
  pair<int,_pbrt::LightBounds> *local_388;
  long local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  LightBounds local_344;
  float local_30c [11];
  pair<int,_pbrt::LightBounds> local_2e0 [12];
  undefined1 auVar39 [16];
  
  uVar27 = CONCAT44(in_register_0000000c,start);
  local_2e0[0].first = start;
  local_4a0.first = end;
  local_4d0 = bitTrail;
  local_4a8 = this;
  if (end <= start) {
    LogFatal<char_const(&)[6],char_const(&)[4],char_const(&)[6],int&,char_const(&)[4],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
               ,0x89,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])"start",
               (char (*) [4])0x57f532,(char (*) [6])"start",&local_2e0[0].first,
               (char (*) [4])0x57f532,&local_4a0.first);
  }
  local_4b0 = bvhLights;
  if (end - start == 1) {
    local_438 = &this->nodes;
    local_4c8 = CONCAT44(local_4c8._4_4_,(int)(this->nodes).nStored);
    CompactLightBounds::CompactLightBounds
              ((CompactLightBounds *)&local_4a0,
               &(bvhLights->
                super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                )._M_impl.super__Vector_impl_data._M_start[start].second,&this->allLightBounds);
    uVar22 = (bvhLights->
             super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
             )._M_impl.super__Vector_impl_data._M_start[start].first;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
         (float)CONCAT71(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_,
                         local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_);
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
         local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    local_2e0[0].first = local_4a0.first;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
         local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
         (float)(uVar22 | 0x80000000);
    pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::
    push_back(local_438,(LightBVHNode *)local_2e0);
    HashMap<pbrt::LightHandle,_unsigned_int,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
    ::Insert(&this->lightToBitTrail,(this->lights).ptr + (int)uVar22,&local_4d0);
    ppVar29 = (local_4b0->
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    __return_storage_ptr__->first = (int)local_4c8;
    pLVar2 = &ppVar29[start].second;
    local_400._0_8_ = *(undefined8 *)&(pLVar2->bounds).pMin;
    local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ =
         *(undefined8 *)((long)&(pLVar2->bounds).pMin + 8);
    uVar27 = *(undefined8 *)((long)&(pLVar2->bounds).pMax + 4);
    uVar45._0_4_ = pLVar2->phi;
    uVar45._4_4_ = (pLVar2->w).super_Tuple3<pbrt::Vector3,_float>.x;
    pfVar28 = (float *)((long)&ppVar29[start].second.bounds.pMax + 8);
    uVar47 = *(undefined8 *)pfVar28;
    uVar54 = *(undefined8 *)(pfVar28 + 2);
    uVar55 = *(undefined8 *)(pfVar28 + 4);
    uVar56 = *(undefined8 *)(pfVar28 + 6);
  }
  else {
    local_360._8_4_ = 0xff7fffff;
    local_360._0_8_ = &DAT_ff7fffffff7fffff;
    local_360._12_4_ = 0xff7fffff;
    local_460.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
    local_460.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
    local_460.pMin.super_Tuple3<pbrt::Point3,_float>.z = 3.4028235e+38;
    local_460.pMax.super_Tuple3<pbrt::Point3,_float>.x = -3.4028235e+38;
    uVar47 = vmovlps_avx(local_360);
    local_460.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar47;
    local_460.pMax.super_Tuple3<pbrt::Point3,_float>.z = (float)((ulong)uVar47 >> 0x20);
    local_380 = (long)start;
    local_398 = (long)end;
    if (start < end) {
      auVar44 = ZEXT464((uint)local_460.pMax.super_Tuple3<pbrt::Point3,_float>.z);
      auVar53 = ZEXT464(0x7f7fffff);
      auVar39 = ZEXT816(0x7f7fffff7f7fffff);
      auVar57 = ZEXT864(CONCAT44(local_460.pMax.super_Tuple3<pbrt::Point3,_float>.y,0xff7fffff));
      pfVar28 = (float *)((long)&(bvhLights->
                                 super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[local_380].second.bounds
                                 .pMax + 8);
      lVar31 = local_398 - local_380;
      local_360._8_4_ = 0xff7fffff;
      local_360._0_8_ = &DAT_ff7fffffff7fffff;
      local_360._12_4_ = 0xff7fffff;
      auVar61 = ZEXT1664(CONCAT412(0x7f7fffff,CONCAT48(0x7f7fffff,0x7f7fffff7f7fffff)));
      auVar64 = ZEXT464(0xff7fffff);
      auVar63 = ZEXT464(0x7f7fffff);
      do {
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(pfVar28 + -5);
        auVar39 = vminps_avx(auVar38,auVar39);
        auVar59 = vminss_avx(ZEXT416((uint)pfVar28[-3]),auVar53._0_16_);
        auVar53 = ZEXT1664(auVar59);
        uVar3 = ((Tuple3<pbrt::Point3,_float> *)(pfVar28 + -2))->x;
        uVar7 = ((Tuple3<pbrt::Point3,_float> *)(pfVar28 + -2))->y;
        auVar58._4_4_ = uVar7;
        auVar58._0_4_ = uVar3;
        auVar58._8_8_ = 0;
        auVar38 = vmaxps_avx(auVar58,auVar57._0_16_);
        auVar57 = ZEXT1664(auVar38);
        auVar58 = vmaxss_avx(ZEXT416((uint)*pfVar28),auVar44._0_16_);
        auVar44 = ZEXT1664(auVar58);
        local_460.pMin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar39);
        local_460.pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar59._0_4_;
        uVar47 = vmovlps_avx(auVar38);
        local_460.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar47;
        local_460.pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar47 >> 0x20);
        local_460.pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar58._0_4_;
        auVar59 = ZEXT416((uint)((pfVar28[-3] + *pfVar28) * 0.5));
        auVar38 = vminss_avx(auVar59,auVar63._0_16_);
        auVar63 = ZEXT1664(auVar38);
        uVar4 = ((Tuple3<pbrt::Point3,_float> *)(pfVar28 + -2))->x;
        uVar8 = ((Tuple3<pbrt::Point3,_float> *)(pfVar28 + -2))->y;
        auVar60._0_4_ = ((float)uVar4 + (float)*(undefined8 *)(pfVar28 + -5)) * 0.5;
        auVar60._4_4_ = ((float)uVar8 + (float)((ulong)*(undefined8 *)(pfVar28 + -5) >> 0x20)) * 0.5
        ;
        auVar60._8_8_ = 0;
        auVar58 = vminps_avx(auVar60,auVar61._0_16_);
        auVar61 = ZEXT1664(auVar58);
        local_360 = vmaxps_avx(auVar60,local_360);
        auVar58 = vmaxss_avx(auVar59,auVar64._0_16_);
        auVar64 = ZEXT1664(auVar58);
        pfVar28 = pfVar28 + 0xe;
        lVar31 = lVar31 + -1;
      } while (lVar31 != 0);
    }
    else {
      auVar61 = ZEXT1664(CONCAT412(0x7f7fffff,CONCAT48(0x7f7fffff,0x7f7fffff7f7fffff)));
      auVar38 = SUB6416(ZEXT464(0x7f7fffff),0);
      auVar64 = ZEXT464(0xff7fffff);
    }
    local_410 = vmovshdup_avx(local_360);
    local_370 = auVar61._0_16_;
    local_420 = vmovshdup_avx(local_370);
    local_3b0 = vsubps_avx(local_360,local_370);
    local_428 = local_410._0_4_ - local_420._0_4_;
    fVar62 = auVar38._0_4_;
    local_4bc = auVar64._0_4_;
    fVar12 = local_4bc - fVar62;
    local_390 = local_380 * 0x38;
    local_378 = local_390 + 4;
    local_380 = local_398 - local_380;
    uVar23 = 0;
    iVar30 = -1;
    auVar44 = ZEXT464(0x7f800000);
    auVar53 = ZEXT864(0) << 0x20;
    uVar47 = vcmpps_avx512vl(local_370,local_360,1);
    local_4ca = (ushort)uVar47;
    uVar47 = vcmpss_avx512f(auVar38,auVar64._0_16_,1);
    bVar19 = (byte)uVar47;
    iVar35 = -1;
    local_4b8 = uVar27;
    local_388 = __return_storage_ptr__;
    do {
      fVar37 = local_360._0_4_;
      local_3c0 = auVar44._0_16_;
      iVar32 = (int)uVar23;
      if ((iVar32 != 0) && (fVar37 = local_410._0_4_, iVar32 != 1)) {
        fVar37 = auVar64._0_4_;
      }
      fVar46 = auVar61._0_4_;
      if ((iVar32 != 0) && (fVar46 = local_420._0_4_, iVar32 != 1)) {
        fVar46 = fVar62;
      }
      if ((fVar37 != fVar46) || (NAN(fVar37) || NAN(fVar46))) {
        lVar31 = 0;
        auVar39._8_4_ = 0xff7fffff;
        auVar39._0_8_ = &DAT_ff7fffffff7fffff;
        auVar39._12_4_ = 0xff7fffff;
        do {
          *(undefined8 *)((long)&local_2e0[0].first + lVar31) = 0x7f7fffff7f7fffff;
          *(undefined8 *)
           ((long)&local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y + lVar31) =
               0xff7fffff7f7fffff;
          uVar47 = vmovlps_avx(auVar39);
          *(undefined8 *)
           ((long)&local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x + lVar31) =
               uVar47;
          *(undefined1 (*) [16])
           ((long)&local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar31) =
               auVar53._0_16_;
          lVar31 = lVar31 + 0x34;
        } while (lVar31 != 0x270);
        lVar31 = local_378;
        lVar34 = local_380;
        local_440 = uVar23;
        local_430 = iVar35;
        local_42c = iVar30;
        if ((int)uVar27 < end) {
          do {
            uVar54 = local_400._0_8_;
            ppVar29 = (bvhLights->
                      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar27 = *(undefined8 *)((long)&ppVar29->first + lVar31);
            uVar47 = *(undefined8 *)((long)&(ppVar29->second).bounds.pMin + lVar31 + 8);
            auVar42._0_4_ = (float)uVar27 + (float)uVar47;
            auVar42._4_4_ = (float)((ulong)uVar27 >> 0x20) + (float)((ulong)uVar47 >> 0x20);
            auVar42._8_8_ = 0;
            auVar59._8_4_ = 0x3f000000;
            auVar59._0_8_ = 0x3f0000003f000000;
            auVar59._12_4_ = 0x3f000000;
            auVar38 = vmulps_avx512vl(auVar42,auVar59);
            auVar38 = vsubps_avx(auVar38,auVar61._0_16_);
            auVar39 = vdivps_avx512vl(auVar38,local_3b0);
            bVar26 = (bool)((byte)local_4ca & 1);
            auVar40._0_4_ = (uint)bVar26 * auVar39._0_4_ | (uint)!bVar26 * auVar38._0_4_;
            bVar26 = (bool)((byte)(local_4ca >> 1) & 1);
            auVar40._4_4_ = (uint)bVar26 * auVar39._4_4_ | (uint)!bVar26 * auVar38._4_4_;
            bVar26 = (bool)((byte)(local_4ca >> 2) & 1);
            auVar40._8_4_ = (uint)bVar26 * auVar39._8_4_ | (uint)!bVar26 * auVar38._8_4_;
            bVar26 = (bool)((byte)(local_4ca >> 3) & 1);
            auVar40._12_4_ = (uint)bVar26 * auVar39._12_4_ | (uint)!bVar26 * auVar38._12_4_;
            if ((float)local_420._0_4_ < (float)local_410._0_4_) {
              auVar38 = vmovshdup_avx(auVar38);
              auVar48._0_4_ = auVar38._0_4_ / local_428;
              auVar48._4_12_ = auVar38._4_12_;
              auVar38 = vinsertps_avx(auVar40,auVar48,0x10);
            }
            else {
              auVar38 = vblendps_avx(auVar40,auVar38,2);
            }
            fVar37 = auVar38._0_4_;
            if ((int)local_440 != 0) {
              if ((int)local_440 == 1) {
                auVar38 = vmovshdup_avx(auVar38);
                fVar37 = auVar38._0_4_;
              }
              else {
                fVar37 = (*(float *)((long)&(ppVar29->second).bounds.pMin + lVar31 + 4) +
                         *(float *)((long)&(ppVar29->second).bounds.pMax + lVar31 + 4U)) * 0.5 -
                         fVar62;
                fVar37 = (float)((uint)(bVar19 & 1) * (int)(fVar37 / fVar12) +
                                (uint)!(bool)(bVar19 & 1) * (int)fVar37);
              }
            }
            uVar22 = (uint)(fVar37 * 12.0);
            if (uVar22 == 0xc) {
              uVar22 = 0xb;
            }
            local_4a0.first = uVar22;
            local_400._0_8_ = local_400._0_8_ & 0xffffffff00000000;
            if ((int)uVar22 < 0) {
              iVar35 = 0xab;
              args_5 = &local_400;
              ppVar25 = &local_4a0;
              goto LAB_00374df2;
            }
            local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = SUB84(uVar54,4);
            local_400.first = 0xc;
            if (0xb < (int)uVar22) {
              iVar35 = 0xac;
              args_5 = &local_400;
              ppVar25 = &local_4a0;
              goto LAB_00374db1;
            }
            uVar23 = (ulong)uVar22;
            pLVar2 = (LightBounds *)(&local_2e0[0].first + uVar23 * 0xd);
            Union((LightBounds *)&local_4a0,pLVar2,(LightBounds *)((long)&ppVar29->first + lVar31));
            *(ulong *)((long)&(&local_2e0[0].second)[uVar23].bounds.pMax.
                              super_Tuple3<pbrt::Point3,_float>.x + 1) =
                 CONCAT17(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_,
                          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_);
            *(ulong *)((long)&(&local_2e0[0].second)[uVar23].bounds.pMax.
                              super_Tuple3<pbrt::Point3,_float>.z + 1) =
                 CONCAT17(local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_,
                          local_4a0.second._21_7_);
            *(ulong *)((long)&(&local_2e0[0].second)[uVar23].w.super_Tuple3<pbrt::Vector3,_float>.x
                      + 1) =
                 CONCAT17(local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_,
                          local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_);
            *(undefined8 *)
             ((long)&(&local_2e0[0].second)[uVar23].w.super_Tuple3<pbrt::Vector3,_float>.z + 1) =
                 local_4a0.second._37_8_;
            (pLVar2->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)local_4a0.first;
            (pLVar2->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            (&local_2e0[0].second)[uVar23].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            (&local_2e0[0].second)[uVar23].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            (&local_2e0[0].second)[uVar23].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                 (float)(int)CONCAT71(local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>
                                      ._1_7_,local_4a0.second.bounds.pMax.
                                             super_Tuple3<pbrt::Point3,_float>.x._0_1_);
            (&local_2e0[0].second)[uVar23].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                 (float)local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            *(ulong *)&(&local_2e0[0].second)[uVar23].bounds.pMax.super_Tuple3<pbrt::Point3,_float>.
                       z = CONCAT71(local_4a0.second._21_7_,
                                    local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z
                                    ._0_1_);
            lVar31 = lVar31 + 0x38;
            lVar34 = lVar34 + -1;
            auVar61 = ZEXT1664(local_370);
            auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
          } while (lVar34 != 0);
        }
        lVar31 = 0x34;
        pvVar36 = (vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>
                   *)0;
        do {
          local_4a0.first = 0x7f7fffff;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
          local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = -3.4028235e+38;
          auVar43._8_4_ = 0xff7fffff;
          auVar43._0_8_ = &DAT_ff7fffffff7fffff;
          auVar43._12_4_ = 0xff7fffff;
          uVar27 = vmovlps_avx(auVar43);
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
               (undefined1)uVar27;
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
               SUB87((ulong)uVar27 >> 8,0);
          local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ = 0;
          local_4a0.second._21_7_ = 0;
          local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = auVar53[8];
          local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ = auVar53._9_7_;
          local_400.first = 0x7f7fffff;
          local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
          local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
          local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = -3.4028235e+38;
          uVar27 = vmovlps_avx(auVar43);
          local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar27;
          local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)((ulong)uVar27 >> 0x20);
          local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
          local_400.second.phi = 0.0;
          local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.x = auVar53._8_4_;
          local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.y = auVar53._12_4_;
          lVar34 = 0;
          uVar23 = local_4a0._0_8_;
          uVar27 = local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          do {
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ = uVar27;
            local_4a0._0_8_ = uVar23;
            Union(&local_344,(LightBounds *)&local_4a0,
                  (LightBounds *)((long)&local_2e0[0].first + lVar34));
            uVar23._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar23._4_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar27._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar27._4_4_ = local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_4a0.second._37_8_ = local_344._41_8_;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>._1_7_ =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>._5_7_;
            local_4a0.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_ =
                 local_344.cosTheta_o._0_1_;
            local_4a0.first = (int)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_4a0.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x._0_1_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._1_7_ =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_;
            local_4a0.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ =
                 local_344.phi._0_1_;
            local_4a0.second._21_7_ = local_344._25_7_;
            lVar34 = lVar34 + 0x34;
          } while (lVar31 != lVar34);
          local_438 = (vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>
                       *)((long)pvVar36 + 1);
          lVar34 = lVar31;
          local_4c8 = (size_t)pvVar36;
          uVar21 = local_400._0_8_;
          uVar47 = local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          do {
            local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ = uVar47;
            local_400._0_8_ = uVar21;
            Union(&local_344,(LightBounds *)&local_400,
                  (LightBounds *)((long)&local_2e0[0].first + lVar34));
            pBVar20 = local_4a8;
            uVar21._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            uVar21._4_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            uVar47._0_4_ = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            uVar47._4_4_ = local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.x =
                 (float)CONCAT31(local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._1_3_,
                                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.y._0_1_);
            local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.y =
                 local_344.w.super_Tuple3<pbrt::Vector3,_float>.z;
            local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.z._0_1_ =
                 local_344.cosTheta_o._0_1_;
            local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_ =
                 local_344.cosTheta_o._1_3_;
            local_400.second._40_5_ = local_344._44_5_;
            local_400.first = (int)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
            local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
            local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z;
            local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x =
                 (float)CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
            local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
                 local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z;
            local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
                 (float)CONCAT71(local_344._25_7_,local_344.phi._0_1_);
            local_400.second.phi = local_344.w.super_Tuple3<pbrt::Vector3,_float>.x;
            lVar34 = lVar34 + 0x34;
          } while (lVar34 != 0x270);
          iVar35 = (int)local_440;
          local_424 = EvaluateCost(local_4a8,(LightBounds *)&local_4a0,&local_460,iVar35);
          FVar41 = EvaluateCost(pBVar20,(LightBounds *)&local_400,&local_460,iVar35);
          local_30c[local_4c8 + -1] = FVar41 + local_424;
          lVar31 = lVar31 + 0x34;
          auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
          pvVar36 = local_438;
        } while (local_438 !=
                 (vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>
                  *)0xb);
        lVar31 = 1;
        iVar35 = local_430;
        iVar30 = local_42c;
        do {
          fVar37 = local_30c[lVar31 + -1];
          uVar27 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)fVar37),1);
          uVar47 = vcmpps_avx512vl(ZEXT416((uint)fVar37),local_3c0,1);
          bVar26 = (bool)((byte)uVar27 & (byte)uVar47 & 1);
          if (bVar26 != false) {
            iVar35 = (int)local_440;
          }
          if (bVar26 != false) {
            iVar30 = (int)lVar31;
          }
          local_3c0._0_4_ = (uint)bVar26 * (int)fVar37 + (uint)!bVar26 * local_3c0._0_4_;
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xb);
        auVar61 = ZEXT1664(local_370);
        uVar27 = local_4b8;
        uVar23 = local_440;
        bvhLights = local_4b0;
      }
      pBVar20 = local_4a8;
      args_5 = &local_4a0;
      auVar64 = ZEXT464((uint)local_4bc);
      uVar22 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar22;
      auVar44 = ZEXT1664(local_3c0);
    } while (uVar22 != 3);
    if (iVar35 == -1) {
      iVar35 = (end + (int)uVar27) / 2;
    }
    else {
      ppVar29 = (bvhLights->
                super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar24 = (pointer)((long)&ppVar29->first + local_390);
      if (end != (int)uVar27) {
        ppVar29 = ppVar29 + local_398;
        bVar26 = auVar61._0_4_ < local_360._0_4_;
        ppVar33 = ppVar24;
LAB_00374b26:
        do {
          ppVar24 = ppVar33;
          uVar27 = *(undefined8 *)&(ppVar24->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          uVar5 = (ppVar24->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
          uVar9 = (ppVar24->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
          auVar49._0_4_ = (float)uVar27 + (float)uVar5;
          auVar49._4_4_ = (float)((ulong)uVar27 >> 0x20) + (float)uVar9;
          auVar49._8_8_ = 0;
          auVar13._8_4_ = 0x3f000000;
          auVar13._0_8_ = 0x3f0000003f000000;
          auVar13._12_4_ = 0x3f000000;
          auVar38 = vmulps_avx512vl(auVar49,auVar13);
          auVar39 = vsubps_avx(auVar38,auVar61._0_16_);
          auVar38 = auVar39;
          if (bVar26) {
            auVar38 = vdivps_avx(auVar39,local_3b0);
          }
          if ((float)local_420._0_4_ < (float)local_410._0_4_) {
            auVar39 = vmovshdup_avx(auVar39);
            auVar50._0_4_ = auVar39._0_4_ / ((float)local_410._0_4_ - (float)local_420._0_4_);
            auVar50._4_12_ = auVar39._4_12_;
            auVar38 = vinsertps_avx(auVar38,auVar50,0x10);
          }
          else {
            auVar38 = vblendps_avx(auVar38,auVar39,2);
          }
          fVar37 = auVar38._0_4_;
          if (iVar35 != 0) {
            if (iVar35 == 1) {
              auVar38 = vmovshdup_avx(auVar38);
              fVar37 = auVar38._0_4_;
            }
            else {
              fVar37 = (*(float *)((long)&(ppVar24->second).bounds.pMin + 8) +
                       *(float *)((long)&(ppVar24->second).bounds.pMax + 8)) * 0.5 - fVar62;
              fVar37 = (float)((uint)(bVar19 & 1) * (int)(fVar37 / fVar12) +
                              (uint)!(bool)(bVar19 & 1) * (int)fVar37);
            }
          }
          iVar32 = (int)(fVar37 * 12.0);
          if (iVar32 == 0xc) {
            iVar32 = 0xb;
          }
          local_2e0[0].first = iVar32;
          if (iVar32 < 0) {
LAB_00374dfd:
            local_4a0._0_8_ = local_4a0._0_8_ & 0xffffffff00000000;
            ppVar25 = local_2e0;
            iVar35 = 0xd4;
LAB_00374df2:
            LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],int&,char_const(&)[2],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,iVar35,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x57016c
                       ,(char (*) [2])0x5859ee,(char (*) [2])0x57016c,&ppVar25->first,
                       (char (*) [2])0x5859ee,&args_5->first);
          }
          local_4a0.first = 0xc;
          if (0xb < iVar32) {
LAB_00374e31:
            ppVar25 = local_2e0;
            iVar35 = 0xd5;
LAB_00374db1:
            LogFatal<char_const(&)[2],char_const(&)[9],char_const(&)[2],int&,char_const(&)[9],int&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                       ,iVar35,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [2])0x57016c,
                       (char (*) [9])"nBuckets",(char (*) [2])0x57016c,&ppVar25->first,
                       (char (*) [9])"nBuckets",&args_5->first);
          }
          if (iVar32 <= iVar30) {
            ppVar24 = ppVar24 + 1;
            ppVar33 = ppVar24;
            if (ppVar24 == ppVar29) goto LAB_0037490d;
            goto LAB_00374b26;
          }
          do {
            ppVar33 = ppVar29;
            ppVar29 = ppVar33 + -1;
            if (ppVar29 == ppVar24) goto LAB_0037490d;
            uVar27 = *(undefined8 *)
                      &ppVar33[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
            uVar6 = ppVar33[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x;
            uVar10 = ppVar33[-1].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y;
            auVar51._0_4_ = (float)uVar27 + (float)uVar6;
            auVar51._4_4_ = (float)((ulong)uVar27 >> 0x20) + (float)uVar10;
            auVar51._8_8_ = 0;
            auVar14._8_4_ = 0x3f000000;
            auVar14._0_8_ = 0x3f0000003f000000;
            auVar14._12_4_ = 0x3f000000;
            auVar38 = vmulps_avx512vl(auVar51,auVar14);
            auVar39 = vsubps_avx(auVar38,auVar61._0_16_);
            auVar38 = auVar39;
            if (bVar26) {
              auVar38 = vdivps_avx(auVar39,local_3b0);
            }
            if ((float)local_420._0_4_ < (float)local_410._0_4_) {
              auVar39 = vmovshdup_avx(auVar39);
              auVar52._0_4_ = auVar39._0_4_ / ((float)local_410._0_4_ - (float)local_420._0_4_);
              auVar52._4_12_ = auVar39._4_12_;
              auVar38 = vinsertps_avx(auVar38,auVar52,0x10);
            }
            else {
              auVar38 = vblendps_avx(auVar38,auVar39,2);
            }
            fVar37 = auVar38._0_4_;
            if (iVar35 != 0) {
              if (iVar35 == 1) {
                auVar38 = vmovshdup_avx(auVar38);
                fVar37 = auVar38._0_4_;
              }
              else {
                fVar37 = (*(float *)((long)&ppVar33[-1].second.bounds.pMin + 8) +
                         *(float *)((long)&ppVar33[-1].second.bounds.pMax + 8)) * 0.5 - fVar62;
                fVar37 = (float)((uint)(bVar19 & 1) * (int)(fVar37 / fVar12) +
                                (uint)!(bool)(bVar19 & 1) * (int)fVar37);
              }
            }
            iVar32 = (int)(fVar37 * 12.0);
            if (iVar32 == 0xc) {
              iVar32 = 0xb;
            }
            local_2e0[0].first = iVar32;
            if (iVar32 < 0) goto LAB_00374dfd;
            local_4a0.first = 0xc;
            if (0xb < iVar32) goto LAB_00374e31;
          } while (iVar30 < iVar32);
          iVar32 = ppVar24->first;
          ppVar24->first = ppVar29->first;
          ppVar29->first = iVar32;
          local_2e0[0]._0_8_ =
               *(undefined8 *)&(ppVar24->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_ =
               *(undefined8 *)((long)&(ppVar24->second).bounds.pMin + 8);
          uVar27 = *(undefined8 *)((long)&(ppVar24->second).bounds.pMax + 4);
          uVar54._0_4_ = (ppVar24->second).phi;
          uVar54._4_4_ = (ppVar24->second).w.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar15 = (ppVar24->second).w.super_Tuple3<pbrt::Vector3,_float>.y;
          uVar47 = *(undefined8 *)
                    ((long)&(ppVar24->second).w.super_Tuple3<pbrt::Vector3,_float> + 8);
          uVar55._0_4_ = (ppVar24->second).cosTheta_e;
          uVar55._4_1_ = (ppVar24->second).twoSided;
          uVar55._5_3_ = *(undefined3 *)&(ppVar24->second).field_0x31;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_ = (undefined5)uVar47;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_ =
               (undefined3)((ulong)uVar47 >> 0x28);
          local_2e0[0].second._40_5_ = (undefined5)uVar55;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar27;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
               (float)((ulong)uVar27 >> 0x20);
          uVar47 = *(undefined8 *)&ppVar33[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>;
          uVar45 = *(undefined8 *)((long)&ppVar33[-1].second.bounds.pMin + 8);
          uVar56 = *(undefined8 *)((long)&ppVar33[-1].second.bounds.pMax + 4);
          FVar41 = ppVar33[-1].second.phi;
          fVar37 = ppVar33[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x;
          uVar16 = *(undefined8 *)((long)&ppVar33[-1].second.phi + 1);
          uVar17 = *(undefined8 *)
                    ((long)&ppVar33[-1].second.w.super_Tuple3<pbrt::Vector3,_float> + 5);
          uVar18 = *(undefined8 *)((long)&ppVar33[-1].second.cosTheta_o + 1);
          *(undefined8 *)((long)&(ppVar24->second).bounds.pMax + 5) =
               *(undefined8 *)((long)&ppVar33[-1].second.bounds.pMax + 5);
          *(undefined8 *)((long)&(ppVar24->second).phi + 1) = uVar16;
          *(undefined8 *)((long)&(ppVar24->second).w.super_Tuple3<pbrt::Vector3,_float> + 5) =
               uVar17;
          *(undefined8 *)((long)&(ppVar24->second).cosTheta_o + 1) = uVar18;
          *(undefined8 *)&(ppVar24->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float> = uVar47;
          *(undefined8 *)((long)&(ppVar24->second).bounds.pMin + 8) = uVar45;
          *(undefined8 *)((long)&(ppVar24->second).bounds.pMax + 4) = uVar56;
          (ppVar24->second).phi = FVar41;
          (ppVar24->second).w.super_Tuple3<pbrt::Vector3,_float>.x = fVar37;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_ =
               (undefined1)(undefined4)uVar54;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_ = (undefined1)uVar15;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_ =
               (undefined3)((uint)uVar15 >> 8);
          *(ulong *)((long)&ppVar33[-1].second.bounds.pMax + 5) =
               CONCAT17(local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z._0_1_,
                        (int7)((ulong)uVar27 >> 8));
          *(ulong *)((long)&ppVar33[-1].second.phi + 1) =
               CONCAT17(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._0_1_,
                        (int7)((ulong)uVar54 >> 8));
          *(ulong *)((long)&ppVar33[-1].second.w.super_Tuple3<pbrt::Vector3,_float> + 5) =
               CONCAT53(local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>._4_5_,
                        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x._1_3_);
          *(ulong *)((long)&ppVar33[-1].second.cosTheta_o + 1) =
               CONCAT53(local_2e0[0].second._40_5_,
                        local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.z._1_3_);
          *(undefined8 *)&ppVar33[-1].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float> =
               local_2e0[0]._0_8_;
          *(undefined8 *)((long)&ppVar33[-1].second.bounds.pMin + 8) =
               local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
          *(undefined8 *)((long)&ppVar33[-1].second.bounds.pMax + 4) = uVar27;
          ppVar33[-1].second.phi = (Float)(undefined4)uVar54;
          ppVar33[-1].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar54._4_4_;
          ppVar33 = ppVar24 + 1;
          local_2e0[0].second.cosTheta_e._1_3_ = uVar55._5_3_;
          local_2e0[0].second.w.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar15;
          local_2e0[0].second.phi = (Float)uVar54._4_4_;
          local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
               (float)(undefined4)uVar54;
        } while (ppVar29 != ppVar24 + 1);
        ppVar24 = ppVar24 + 1;
      }
LAB_0037490d:
      iVar35 = (int)((ulong)((long)ppVar24 -
                            (long)(local_4b0->
                                  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      iVar30 = (int)local_4b8;
      if (iVar35 == iVar30 || iVar35 == end) {
        iVar35 = (end + iVar30) / 2;
      }
      if ((iVar35 <= iVar30) || (end <= iVar35)) {
        LogFatal<char_const(&)[25]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                   ,0xdb,"Check failed: %s",(char (*) [25])"mid > start && mid < end");
      }
    }
    local_4c8 = (local_4a8->nodes).nStored;
    local_2e0[0].first = 0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    local_2e0[0].second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    local_2e0[0].second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    local_2e0[0].second.phi = 0.0;
    pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::
    push_back(&local_4a8->nodes,(LightBVHNode *)local_2e0);
    bvhLights_00 = local_4b0;
    local_2e0[0].first = depth;
    local_4a0.first = 0x40;
    if (0x3f < depth) {
      LogFatal<char_const(&)[6],char_const(&)[3],char_const(&)[6],int&,char_const(&)[3],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                 ,0xe1,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [6])0xa386dd,
                 (char (*) [3])0xa3e398,(char (*) [6])0xa386dd,&local_2e0[0].first,
                 (char (*) [3])0xa3e398,&local_4a0.first);
    }
    buildBVH(local_2e0,pBVar20,local_4b0,(int)local_4b8,iVar35,local_4d0,depth + 1,alloc);
    local_4a0.first = (int)local_4c8 + 1;
    local_400.first = local_2e0[0].first;
    if (local_4a0.first != local_2e0[0].first) {
      LogFatal<char_const(&)[14],char_const(&)[13],char_const(&)[14],int&,char_const(&)[13],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lightsamplers.cpp"
                 ,0xe4,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [14])"nodeIndex + 1"
                 ,(char (*) [13])"child0.first",(char (*) [14])"nodeIndex + 1",&local_4a0.first,
                 (char (*) [13])"child0.first",&local_400.first);
    }
    buildBVH(&local_4a0,pBVar20,bvhLights_00,iVar35,end,local_4d0 | 1 << (depth & 0x1fU),depth + 1,
             alloc);
    Union((LightBounds *)&local_400,&local_2e0[0].second,&local_4a0.second);
    CompactLightBounds::CompactLightBounds
              ((CompactLightBounds *)&local_344,(LightBounds *)&local_400,&pBVar20->allLightBounds);
    pLVar11 = (pBVar20->nodes).ptr;
    iVar35 = (int)local_4c8;
    *(ulong *)(pLVar11[iVar35].lightBounds.qb[0] + 2) =
         CONCAT71(local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>._5_7_,
                  local_344.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y._0_1_);
    pLVar1 = pLVar11 + iVar35;
    (pLVar1->lightBounds).w =
         (OctahedralVector)local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    (pLVar1->lightBounds).phi = local_344.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    *(undefined8 *)&(pLVar1->lightBounds).field_2 = local_344.bounds._8_8_;
    pLVar11[iVar35].field_1 =
         (anon_struct_4_2_cf919bac_for_LightBVHNode_1)(local_4a0.first & 0x7fffffff);
    local_388->first = iVar35;
    uVar27 = CONCAT44(local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y,
                      local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.x);
    uVar45 = CONCAT44(local_400.second.phi,
                      local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z);
    uVar47 = CONCAT44(local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z,
                      local_400.second.bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y);
    uVar54 = CONCAT44(local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.x,local_400.second.phi);
    uVar55 = CONCAT44(local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.z,
                      local_400.second.w.super_Tuple3<pbrt::Vector3,_float>.y);
    uVar56 = CONCAT35(local_400.second.cosTheta_e._1_3_,local_400.second._40_5_);
    __return_storage_ptr__ = local_388;
  }
  (__return_storage_ptr__->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (float)local_400.first;
  (__return_storage_ptr__->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  *(undefined8 *)&(__return_storage_ptr__->second).bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_400.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>._4_8_;
  (__return_storage_ptr__->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)uVar27;
  (__return_storage_ptr__->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar27 >> 0x20);
  (__return_storage_ptr__->second).phi = (Float)(int)uVar45;
  (__return_storage_ptr__->second).w.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)uVar45 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->second).bounds.pMax.super_Tuple3<pbrt::Point3,_float>.z =
       uVar47;
  (__return_storage_ptr__->second).w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar54;
  (__return_storage_ptr__->second).w.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar54 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->second).w.super_Tuple3<pbrt::Vector3,_float>.z = uVar55;
  (__return_storage_ptr__->second).cosTheta_e = (Float)(int)uVar56;
  (__return_storage_ptr__->second).twoSided = (bool)(char)((ulong)uVar56 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->second).field_0x31 = (int3)((ulong)uVar56 >> 0x28);
  return __return_storage_ptr__;
}

Assistant:

std::pair<int, LightBounds> BVHLightSampler::buildBVH(
    std::vector<std::pair<int, LightBounds>> &bvhLights, int start, int end,
    uint32_t bitTrail, int depth, Allocator alloc) {
    CHECK_LT(start, end);
    // Initialize leaf node if only a single light remains
    if (end - start == 1) {
        int nodeIndex = nodes.size();
        CompactLightBounds cb(bvhLights[start].second, allLightBounds);
        int lightIndex = bvhLights[start].first;
        nodes.push_back(LightBVHNode::MakeLeaf(lightIndex, cb));
        lightToBitTrail.Insert(lights[lightIndex], bitTrail);
        return {nodeIndex, bvhLights[start].second};
    }

    // Choose split dimension and position using modified SAH
    // Compute bounds and centroid bounds for lights
    Bounds3f bounds, centroidBounds;
    for (int i = start; i < end; ++i) {
        const LightBounds &lb = bvhLights[i].second;
        bounds = Union(bounds, lb.bounds);
        centroidBounds = Union(centroidBounds, lb.Centroid());
    }

    Float minCost = Infinity;
    int minCostSplitBucket = -1, minCostSplitDim = -1;
    constexpr int nBuckets = 12;
    for (int dim = 0; dim < 3; ++dim) {
        // Compute minimum cost bucket for splitting along dimension _dim_
        if (centroidBounds.pMax[dim] == centroidBounds.pMin[dim])
            continue;
        // Compute _LightBounds_ for each bucket
        LightBounds bucketLightBounds[nBuckets];
        for (int i = start; i < end; ++i) {
            Point3f pc = bvhLights[i].second.Centroid();
            int b = nBuckets * centroidBounds.Offset(pc)[dim];
            if (b == nBuckets)
                b = nBuckets - 1;
            CHECK_GE(b, 0);
            CHECK_LT(b, nBuckets);
            bucketLightBounds[b] = Union(bucketLightBounds[b], bvhLights[i].second);
        }

        // Compute costs for splitting lights after each bucket
        Float cost[nBuckets - 1];
        for (int i = 0; i < nBuckets - 1; ++i) {
            // Find _LightBounds_ for lights below and above bucket split
            LightBounds b0, b1;
            for (int j = 0; j <= i; ++j)
                b0 = Union(b0, bucketLightBounds[j]);
            for (int j = i + 1; j < nBuckets; ++j)
                b1 = Union(b1, bucketLightBounds[j]);

            // Compute final light split cost for bucket
            cost[i] = EvaluateCost(b0, bounds, dim) + EvaluateCost(b1, bounds, dim);
        }

        // Find light split that minimizes SAH metric
        for (int i = 1; i < nBuckets - 1; ++i) {
            if (cost[i] > 0 && cost[i] < minCost) {
                minCost = cost[i];
                minCostSplitBucket = i;
                minCostSplitDim = dim;
            }
        }
    }

    // Partition lights according to chosen split
    int mid;
    if (minCostSplitDim == -1) {
        mid = (start + end) / 2;
    } else {
        const auto *pmid = std::partition(
            &bvhLights[start], &bvhLights[end - 1] + 1,
            [=](const std::pair<int, LightBounds> &l) {
                int b = nBuckets *
                        centroidBounds.Offset(l.second.Centroid())[minCostSplitDim];
                if (b == nBuckets)
                    b = nBuckets - 1;
                CHECK_GE(b, 0);
                CHECK_LT(b, nBuckets);
                return b <= minCostSplitBucket;
            });
        mid = pmid - &bvhLights[0];
        if (mid == start || mid == end)
            mid = (start + end) / 2;
        CHECK(mid > start && mid < end);
    }

    // Allocate interior _LightBVHNode_ and recursively initialize children
    int nodeIndex = nodes.size();
    nodes.push_back(LightBVHNode());
    CHECK_LT(depth, 64);
    std::pair<int, LightBounds> child0 =
        buildBVH(bvhLights, start, mid, bitTrail, depth + 1, alloc);
    CHECK_EQ(nodeIndex + 1, child0.first);
    std::pair<int, LightBounds> child1 =
        buildBVH(bvhLights, mid, end, bitTrail | (1u << depth), depth + 1, alloc);

    // Initialize interior node and return node index and bounds
    LightBounds lb = Union(child0.second, child1.second);
    CompactLightBounds cb(lb, allLightBounds);
    nodes[nodeIndex] = LightBVHNode::MakeInterior(child1.first, cb);
    return {nodeIndex, lb};
}